

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9MemObjInitFromString(jx9_vm *pVm,jx9_value *pObj,SyString *pVal)

{
  sxi32 extraout_EAX;
  sxi32 sVar1;
  
  SyZero(pObj,0x40);
  pObj->pVm = pVm;
  (pObj->sBlob).pBlob = (void *)0x0;
  (pObj->sBlob).nByte = 0;
  (pObj->sBlob).mByte = 0;
  (pObj->sBlob).pAllocator = &pVm->sAllocator;
  (pObj->sBlob).nFlags = 0;
  sVar1 = extraout_EAX;
  if (pVal != (SyString *)0x0) {
    sVar1 = SyBlobAppend(&pObj->sBlob,pVal->zString,pVal->nByte);
  }
  pObj->iFlags = 1;
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjInitFromString(jx9_vm *pVm, jx9_value *pObj, const SyString *pVal)
{
	/* Zero the structure */
	SyZero(pObj, sizeof(jx9_value));
	/* Initialize fields */
	pObj->pVm = pVm;
	SyBlobInit(&pObj->sBlob, &pVm->sAllocator);
	if( pVal ){
		/* Append contents */
		SyBlobAppend(&pObj->sBlob, (const void *)pVal->zString, pVal->nByte);
	}
	/* Set the desired type */
	pObj->iFlags = MEMOBJ_STRING;
	return SXRET_OK;
}